

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Surface.cc
# Opt level: O3

void __thiscall
SDL2pp::Surface::Blit(Surface *this,Optional<Rect> *srcrect,Surface *dst,Rect *dstrect)

{
  int iVar1;
  Exception *this_00;
  SDL_Rect tmpdstrect;
  
  if ((srcrect->super___optional_storage<SDL2pp::Rect,_true>).__engaged_ == false) {
    srcrect = (Optional<Rect> *)0x0;
  }
  iVar1 = SDL_UpperBlit(this->surface_,srcrect,dst->surface_);
  if (iVar1 == 0) {
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x50);
  Exception::Exception(this_00,"SDL_BlitSurface");
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void Surface::Blit(const Optional<Rect>& srcrect, Surface& dst, const Rect& dstrect) {
	SDL_Rect tmpdstrect = dstrect; // 4th argument is non-const; does it modify rect?
	if (SDL_BlitSurface(surface_, srcrect ? &*srcrect : nullptr, dst.Get(), &tmpdstrect) != 0)
		throw Exception("SDL_BlitSurface");
}